

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaran.c
# Opt level: O0

double dlaran_sluslu(int *iseed)

{
  int iVar1;
  float ret_val;
  int *iseed_local;
  
  dlaran_sluslu::it4 = (iseed[3] * 0x9f5) % 0x1000;
  iVar1 = (iseed[3] * 0x9f5) / 0x1000 + iseed[2] * 0x9f5 + iseed[3] * 0x9cc;
  dlaran_sluslu::it3 = iVar1 % 0x1000;
  iVar1 = iVar1 / 0x1000 + iseed[1] * 0x9f5 + iseed[2] * 0x9cc + iseed[3] * 0x142;
  dlaran_sluslu::it2 = iVar1 % 0x1000;
  dlaran_sluslu::it1 =
       (iVar1 / 0x1000 + *iseed * 0x9f5 + iseed[1] * 0x9cc + iseed[2] * 0x142 + iseed[3] * 0x1ee) %
       0x1000;
  *iseed = dlaran_sluslu::it1;
  iseed[1] = dlaran_sluslu::it2;
  iseed[2] = dlaran_sluslu::it3;
  iseed[3] = dlaran_sluslu::it4;
  return (double)(((((float)dlaran_sluslu::it4 * 0.00024414062 + (float)dlaran_sluslu::it3) *
                    0.00024414062 + (float)dlaran_sluslu::it2) * 0.00024414062 +
                  (float)dlaran_sluslu::it1) * 0.00024414062);
}

Assistant:

double dlaran_sluslu(int *iseed)
{
    /* System generated locals */
    float ret_val;

    /* Local variables */
    static int it1, it2, it3, it4;


/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       February 29, 1992   


    Purpose   
    =======   

    SLARAN returns a random real number from a uniform (0,1)   
    distribution.   

    Arguments   
    =========   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    Further Details   
    ===============   

    This routine uses a multiplicative congruential method with modulus   
    2**48 and multiplier 33952834046453 (see G.S.Fishman,   
    'Multiplicative congruential random number generators with modulus   
    2**b: an exhaustive analysis for b = 32 and a partial analysis for   
    b = 48', Math. Comp. 189, pp 331-344, 1990).   

    48-bit integers are stored in 4 integer array elements with 12 bits   
    per element. Hence the routine is portable across machines with   
    integers of 32 bits or more.   

    ===================================================================== 
  


       multiply the seed by the multiplier modulo 2**48   

       Parameter adjustments */
    --iseed;

    /* Function Body */
    it4 = iseed[4] * 2549;
    it3 = it4 / 4096;
    it4 -= it3 << 12;
    it3 = it3 + iseed[3] * 2549 + iseed[4] * 2508;
    it2 = it3 / 4096;
    it3 -= it2 << 12;
    it2 = it2 + iseed[2] * 2549 + iseed[3] * 2508 + iseed[4] * 322;
    it1 = it2 / 4096;
    it2 -= it1 << 12;
    it1 = it1 + iseed[1] * 2549 + iseed[2] * 2508 + iseed[3] * 322 + iseed[4] 
	    * 494;
    it1 %= 4096;

/*     return updated seed */

    iseed[1] = it1;
    iseed[2] = it2;
    iseed[3] = it3;
    iseed[4] = it4;

/*     convert 48-bit int to a real number in the interval (0,1) */

    ret_val = ((float) it1 + ((float) it2 + ((float) it3 + (float) it4 * 
	    2.44140625e-4f) * 2.44140625e-4f) * 2.44140625e-4f) * 
	    2.44140625e-4f;
    return ret_val;

/*     End of SLARAN */

}